

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stream.cpp
# Opt level: O3

void __thiscall lambda_collect_Test::TestBody(lambda_collect_Test *this)

{
  bool bVar1;
  char *message;
  initializer_list<int> __l;
  AssertionResult gtest_ar;
  Collect<std::vector> local_69;
  vector<int,_std::allocator<int>_> local_68;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  vector<int,_std::allocator<int>_> local_40;
  TakeStream<lambda::streams::MapStream<lambda::streams::IntsStream<int>,_lambda::Curried<std::multiplies<void>,_int>_>,_int>
  local_28;
  
  local_28._0_8_ = (long *)0x200000000;
  local_28.stream._4_8_ = 0x600000004;
  local_28.stream.fn.args.super__Tuple_impl<0UL,_int>.super__Head_base<0UL,_int,_false>._M_head_impl
       = (_Tuple_impl<0UL,_int>)0x8;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_68,__l,(allocator_type *)&local_40);
  local_28.stream._4_8_ = local_28.stream._4_8_ & 0xffffffff00000000;
  local_28.stream.fn.args.super__Tuple_impl<0UL,_int>.super__Head_base<0UL,_int,_false>._M_head_impl
       = (_Tuple_impl<0UL,_int>)0x2;
  local_28.count = 0;
  local_28.num = 5;
  lambda::streams::Collect<std::vector>::
  pipe<lambda::streams::TakeStream<lambda::streams::MapStream<lambda::streams::IntsStream<int>,lambda::Curried<std::multiplies<void>,int>>,int>>
            (&local_40,&local_69,&local_28);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            (local_50,"vector(0, 2, 4, 6, 8)","ints(0) | map(multiplies(2)) | take(5) | collect()",
             &local_68,&local_40);
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_stream.cpp"
               ,0x31,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if ((long *)local_28._0_8_ != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_28._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_28._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(lambda, stream) {
    auto s = stream(vector(1, 2, 3, 4)) | map(plus(1)) | filter(less(4));
    while (auto val = s.next()) {
        display << val << '\n';
    }
}